

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnLoopExpr(BinaryReaderInterp *this,Type sig_type)

{
  bool bVar1;
  Result result;
  Offset offset;
  BinaryReaderInterp *this_local;
  Type sig_type_local;
  
  this_local._0_4_ = sig_type.enum_;
  result = SharedValidator::OnLoop
                     (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                      sig_type);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    offset = Istream::end(this->istream_);
    PushLabel(this,offset,0xffffffff);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnLoopExpr(Type sig_type) {
  CHECK_RESULT(validator_.OnLoop(loc, sig_type));
  PushLabel(istream_.end());
  return Result::Ok;
}